

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

LY_ERR lyb_parse_schema_nested_ext
                 (lyd_lyb_ctx *lybctx,lyd_node *parent,char *mod_name,lysc_node **snode)

{
  lysc_ext_instance *name_00;
  lysc_node **prefix;
  char *parent_00;
  LY_ERR LVar1;
  size_t name_len;
  size_t local_60;
  lysc_ext_instance *local_48;
  lysc_ext_instance *ext;
  char *name;
  LY_ERR r;
  LY_ERR rc;
  lysc_node **snode_local;
  char *mod_name_local;
  lyd_node *parent_local;
  lyd_lyb_ctx *lybctx_local;
  
  name._4_4_ = 0;
  ext = (lysc_ext_instance *)0x0;
  _r = snode;
  snode_local = (lysc_node **)mod_name;
  mod_name_local = (char *)parent;
  parent_local = (lyd_node *)lybctx;
  if (parent == (lyd_node *)0x0) {
    __assert_fail("parent",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                  ,0x366,
                  "LY_ERR lyb_parse_schema_nested_ext(struct lyd_lyb_ctx *, const struct lyd_node *, const char *, const struct lysc_node **)"
                 );
  }
  name._4_4_ = lyb_read_string((char **)&ext,'\x02',lybctx->lybctx);
  parent_00 = mod_name_local;
  prefix = snode_local;
  LVar1 = name._4_4_;
  if (name._4_4_ == LY_SUCCESS) {
    if (snode_local == (lysc_node **)0x0) {
      local_60 = 0;
    }
    else {
      local_60 = strlen((char *)snode_local);
    }
    name_00 = ext;
    name_len = strlen((char *)ext);
    name._0_4_ = ly_nested_ext_schema
                           ((lyd_node *)parent_00,(lysc_node *)0x0,(char *)prefix,local_60,
                            LY_VALUE_JSON,(void *)0x0,(char *)name_00,name_len,_r,&local_48);
    if ((LY_ERR)name == LY_ENOT) {
      ly_log(*(ly_ctx **)&(parent_local[0x4b].parent)->field_0,LY_LLERR,LY_EINVAL,
             "Failed to parse node \"%s\" as nested extension instance data.",ext);
      name._4_4_ = LY_EINVAL;
      LVar1 = name._4_4_;
    }
    else {
      LVar1 = (LY_ERR)name;
      if ((LY_ERR)name == LY_SUCCESS) {
        lyb_cache_module_hash((*_r)->module);
        LVar1 = name._4_4_;
      }
    }
  }
  name._4_4_ = LVar1;
  free(ext);
  return name._4_4_;
}

Assistant:

static LY_ERR
lyb_parse_schema_nested_ext(struct lyd_lyb_ctx *lybctx, const struct lyd_node *parent, const char *mod_name,
        const struct lysc_node **snode)
{
    LY_ERR rc = LY_SUCCESS, r;
    char *name = NULL;
    struct lysc_ext_instance *ext;

    assert(parent);

    /* read schema node name */
    LY_CHECK_GOTO(rc = lyb_read_string(&name, sizeof(uint16_t), lybctx->lybctx), cleanup);

    /* check for extension data */
    r = ly_nested_ext_schema(parent, NULL, mod_name, mod_name ? strlen(mod_name) : 0, LY_VALUE_JSON, NULL, name,
            strlen(name), snode, &ext);
    if (r == LY_ENOT) {
        /* failed to parse */
        LOGERR(lybctx->lybctx->ctx, LY_EINVAL, "Failed to parse node \"%s\" as nested extension instance data.", name);
        rc = LY_EINVAL;
        goto cleanup;
    } else if (r) {
        /* error */
        rc = r;
        goto cleanup;
    }

    /* fill cached hashes in the module, it may be from a different context */
    lyb_cache_module_hash((*snode)->module);

cleanup:
    free(name);
    return rc;
}